

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O1

void __thiscall
YAML::SingleDocParser::HandleFlowSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *this_00;
  undefined4 *puVar1;
  bool bVar2;
  Token *pTVar3;
  Exception *pEVar4;
  Mark local_58;
  string local_48;
  
  Scanner::pop(this->m_scanner);
  this_00 = (deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *)
            (this->m_pCollectionStack)._M_t.
            super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
            ._M_t.
            super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
            .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl;
  local_48._M_dataplus._M_p._0_4_ = 4;
  puVar1 = *(undefined4 **)(this_00 + 0x30);
  if (puVar1 == (undefined4 *)(*(long *)(this_00 + 0x40) + -4)) {
    std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>::
    _M_push_back_aux<YAML::CollectionType::value_const&>(this_00,(value *)&local_48);
  }
  else {
    *puVar1 = 4;
    *(undefined4 **)(this_00 + 0x30) = puVar1 + 1;
  }
  while( true ) {
    bVar2 = Scanner::empty(this->m_scanner);
    if (bVar2) {
      pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
      local_58 = Scanner::mark(this->m_scanner);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"end of sequence flow not found","");
      Exception::Exception(pEVar4,&local_58,&local_48);
      *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
      __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
    }
    pTVar3 = Scanner::peek(this->m_scanner);
    if (pTVar3->type == FLOW_SEQ_END) break;
    HandleNode(this,eventHandler);
    bVar2 = Scanner::empty(this->m_scanner);
    if (bVar2) {
      pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
      local_58 = Scanner::mark(this->m_scanner);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"end of sequence flow not found","");
      Exception::Exception(pEVar4,&local_58,&local_48);
      *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
      __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
    }
    pTVar3 = Scanner::peek(this->m_scanner);
    if (pTVar3->type != FLOW_SEQ_END) {
      if (pTVar3->type != FLOW_ENTRY) {
        pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"end of sequence flow not found","");
        Exception::Exception(pEVar4,&pTVar3->mark,&local_48);
        *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
        __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
      }
      Scanner::pop(this->m_scanner);
    }
  }
  Scanner::pop(this->m_scanner);
  std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::pop_back
            ((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *)
             (this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
  return;
}

Assistant:

void SingleDocParser::HandleFlowSequence(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::FlowSeq);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ_FLOW);

    // first check for end
    if (m_scanner.peek().type == Token::FLOW_SEQ_END) {
      m_scanner.pop();
      break;
    }

    // then read the node
    HandleNode(eventHandler);

    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ_FLOW);

    // now eat the separator (or could be a sequence end, which we ignore - but
    // if it's neither, then it's a bad node)
    Token& token = m_scanner.peek();
    if (token.type == Token::FLOW_ENTRY)
      m_scanner.pop();
    else if (token.type != Token::FLOW_SEQ_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_SEQ_FLOW);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::FlowSeq);
}